

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O2

void MULTICLASS::print_probability(vw *all,example *ec,uint32_t prediction)

{
  bool holdout_set_off;
  shared_data *this;
  size_t current_pass;
  allocator local_284;
  allocator local_283;
  char temp_str [10];
  string local_278;
  string local_258;
  char label_str [512];
  
  snprintf(temp_str,10,"%d(%2.0f%%)",(double)((ec->pred).scalars._begin[prediction - 1] * 100.0));
  snprintf(label_str,0x200,"%u",(ulong)(ec->l).multi.label);
  this = all->sd;
  current_pass = all->current_pass;
  holdout_set_off = all->holdout_set_off;
  std::__cxx11::string::string((string *)&local_258,label_str,&local_283);
  std::__cxx11::string::string((string *)&local_278,temp_str,&local_284);
  shared_data::print_update
            (this,holdout_set_off,current_pass,&local_258,&local_278,ec->num_features,
             all->progress_add,all->progress_arg);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  return;
}

Assistant:

void print_probability(vw& all, example& ec, uint32_t prediction)
{
  char temp_str[10];
  sprintf_s(temp_str, 10, "%d(%2.0f%%)", prediction, 100 * ec.pred.scalars[prediction - 1]);

  char label_str[512];
  sprintf_s(label_str, 512, "%u", ec.l.multi.label);

  all.sd->print_update(
      all.holdout_set_off, all.current_pass, label_str, temp_str, ec.num_features, all.progress_add, all.progress_arg);
}